

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphml.hpp
# Opt level: O2

void __thiscall bal::GraphMLStreamWriter::write_variables(GraphMLStreamWriter *this,Cnf *value)

{
  _func_int *p_Var1;
  char *name;
  long lVar2;
  long lVar3;
  Cnf *pCVar4;
  GraphMLStreamWriter *pGVar5;
  uint uVar6;
  formula_named_variables_t *pfVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  int i;
  int i_1;
  undefined8 uStack_50;
  char acStack_48 [8];
  Cnf *local_40;
  GraphMLStreamWriter *local_38;
  
  uStack_50 = 0x10e321;
  local_38 = this;
  uVar6 = (*(value->super_Formula)._vptr_Formula[1])(value);
  lVar2 = -((ulong)uVar6 + 0xf & 0xfffffffffffffff0);
  lVar3 = lVar2 + -0x48;
  p_Var1 = (value->super_Formula)._vptr_Formula[1];
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10e33d;
  uVar6 = (*p_Var1)(value);
  for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
    acStack_48[uVar9 + lVar3 + 0x48] = '\0';
  }
  local_40 = value;
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10e35c;
  pfVar7 = Formula::get_named_variables_abi_cxx11_(&value->super_Formula);
  for (p_Var8 = (pfVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left; pCVar4 = local_40,
      (_Rb_tree_header *)p_Var8 != &(pfVar7->_M_t)._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    for (uVar9 = 0; pGVar5 = local_38, uVar9 < *(uint *)&p_Var8[2]._M_parent; uVar9 = uVar9 + 1) {
      uVar6 = *(uint *)(*(long *)(p_Var8 + 2) + uVar9 * 4);
      if (2 < uVar6 + 1) {
        uVar6 = (uVar6 >> 1) - 1;
        if (acStack_48[(ulong)uVar6 + lVar3 + 0x48] == '\0') {
          name = *(char **)(p_Var8 + 1);
          *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10e3ad;
          write_variable(pGVar5,uVar6,name,(uint)uVar9);
          acStack_48[(ulong)uVar6 + lVar3 + 0x48] = '\x01';
        }
      }
    }
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10e3bc;
  }
  uVar9 = 0;
  while( true ) {
    p_Var1 = (pCVar4->super_Formula)._vptr_Formula[1];
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10e3d1;
    uVar6 = (*p_Var1)(pCVar4);
    pGVar5 = local_38;
    if (uVar6 <= uVar9) break;
    if (acStack_48[uVar9 + lVar3 + 0x48] == '\0') {
      *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10e3ef;
      write_variable(pGVar5,(variableid_t)uVar9,(char *)0x0,0);
      acStack_48[uVar9 + lVar3 + 0x48] = '\x01';
    }
    uVar9 = uVar9 + 1;
  }
  return;
}

Assistant:

void write_variables(const Cnf& value) {
            bool is_processed[value.variables_size()];
            std::fill(is_processed, is_processed + value.variables_size(), false);
            
            const formula_named_variables_t& nv = value.get_named_variables();
            for (formula_named_variables_t::const_iterator it = nv.begin(); it != nv.end(); ++it) {
                const VariablesArray& nv_variables = it->second;
                const std::string& nv_name = it->first;
                for (auto i = 0; i < nv_variables.size(); i++) {
                    if (literal_t__is_variable(nv_variables.data()[i])) {
                        const variableid_t variable_id = literal_t__variable_id(nv_variables.data()[i]);
                        if (!is_processed[variable_id]) {
                            write_variable(variable_id, nv_name.c_str(), i);
                            is_processed[variable_id] = true;
                        };
                    };
                };
            };
            
            for (auto i = 0; i < value.variables_size(); i++) {
                if (!is_processed[i]) {
                    write_variable(i);
                    is_processed[i] = true;
                };
            };
        }